

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O1

void __thiscall
duckdb::TextTreeRenderer::RenderTopLayer
          (TextTreeRenderer *this,RenderTree *root,ostream *ss,idx_t y)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  ulong x;
  ulong x_00;
  char *pcVar4;
  bool bVar5;
  allocator local_71;
  string local_70;
  string local_50;
  
  if (root->width != 0) {
    x = 0;
    do {
      if ((this->config).maximum_render_width <= (this->config).node_render_width * x) break;
      bVar2 = RenderTree::HasNode(root,x,y);
      if (bVar2) {
        pcVar4 = (this->config).LTCORNER;
        iVar1 = (int)ss;
        if (pcVar4 == (char *)0x0) {
          ::std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)ss + -0x18));
        }
        else {
          sVar3 = strlen(pcVar4);
          ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar4,sVar3);
        }
        ::std::__cxx11::string::string((string *)&local_50,(this->config).HORIZONTAL,&local_71);
        StringUtil::Repeat(&local_70,&local_50,((this->config).node_render_width >> 1) - 1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (ss,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                       local_70._M_dataplus._M_p._0_1_),local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (y == 0) {
          pcVar4 = (this->config).HORIZONTAL;
        }
        else {
          pcVar4 = (this->config).DMIDDLE;
        }
        if (pcVar4 == (char *)0x0) {
          ::std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)ss + -0x18));
        }
        else {
          sVar3 = strlen(pcVar4);
          ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar4,sVar3);
        }
        ::std::__cxx11::string::string((string *)&local_50,(this->config).HORIZONTAL,&local_71);
        StringUtil::Repeat(&local_70,&local_50,((this->config).node_render_width >> 1) - 1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (ss,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                       local_70._M_dataplus._M_p._0_1_),local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
            &local_70.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_))
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        pcVar4 = (this->config).RTCORNER;
        if (pcVar4 == (char *)0x0) {
          ::std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)ss + -0x18));
        }
        else {
          sVar3 = strlen(pcVar4);
          ::std::__ostream_insert<char,std::char_traits<char>>(ss,pcVar4,sVar3);
        }
      }
      else if (x < root->width) {
        bVar2 = false;
        x_00 = x;
        do {
          bVar5 = bVar2 == false;
          bVar2 = true;
          if (bVar5) {
            bVar2 = RenderTree::HasNode(root,x_00,y);
          }
          x_00 = x_00 + 1;
        } while (x_00 < root->width);
        if (bVar2 != false) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
          StringUtil::Repeat(&local_70,&local_50,(this->config).node_render_width);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (ss,(char *)CONCAT71(local_70._M_dataplus._M_p._1_7_,
                                         local_70._M_dataplus._M_p._0_1_),local_70._M_string_length)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_
                                    ));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
      x = x + 1;
    } while (x < root->width);
  }
  local_70._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>(ss,(char *)&local_70,1);
  return;
}

Assistant:

void TextTreeRenderer::RenderTopLayer(RenderTree &root, std::ostream &ss, idx_t y) {
	for (idx_t x = 0; x < root.width; x++) {
		if (x * config.node_render_width >= config.maximum_render_width) {
			break;
		}
		if (root.HasNode(x, y)) {
			ss << config.LTCORNER;
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			if (y == 0) {
				// top level node: no node above this one
				ss << config.HORIZONTAL;
			} else {
				// render connection to node above this one
				ss << config.DMIDDLE;
			}
			ss << StringUtil::Repeat(config.HORIZONTAL, config.node_render_width / 2 - 1);
			ss << config.RTCORNER;
		} else {
			bool has_adjacent_nodes = false;
			for (idx_t i = 0; x + i < root.width; i++) {
				has_adjacent_nodes = has_adjacent_nodes || root.HasNode(x + i, y);
			}
			if (!has_adjacent_nodes) {
				// There are no nodes to the right side of this position
				// no need to fill the empty space
				continue;
			}
			// there are nodes next to this, fill the space
			ss << StringUtil::Repeat(" ", config.node_render_width);
		}
	}
	ss << '\n';
}